

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

double alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
       compute_expected_cost
                 (V *values,int num_keys,double density,double expected_insert_frac,
                 LinearModel<int> *existing_model,bool use_sampling,DataNodeStats *stats)

{
  int data_capacity;
  undefined7 in_register_00000009;
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  ExpectedSearchIterationsAccumulator acc;
  LinearModel<int> local_78;
  double local_68;
  undefined8 uStack_60;
  ExpectedIterationsAndShiftsAccumulator local_50;
  
  if ((int)CONCAT71(in_register_00000009,use_sampling) != 0) {
    dVar2 = compute_expected_cost_sampling
                      (values,num_keys,density,expected_insert_frac,existing_model,stats);
    return dVar2;
  }
  if (num_keys == 0) {
    dVar2 = 0.0;
  }
  else {
    dVar2 = (double)num_keys;
    local_78.a_ = 0.0;
    local_78.b_ = 0.0;
    data_capacity = (int)(dVar2 / density);
    if ((int)(dVar2 / density) < num_keys + 1) {
      data_capacity = num_keys + 1;
    }
    if (existing_model == (LinearModel<int> *)0x0) {
      existing_model = &local_78;
      local_68 = dVar2;
      build_model(values,num_keys,existing_model,false);
      dVar2 = local_68;
    }
    local_78.a_ = ((double)data_capacity / dVar2) * existing_model->a_;
    local_78.b_ = ((double)data_capacity / dVar2) * existing_model->b_;
    if ((expected_insert_frac != 0.0) || (NAN(expected_insert_frac))) {
      local_50.super_StatAccumulator._vptr_StatAccumulator =
           (_func_int **)&PTR__StatAccumulator_00113d28;
      local_50.cumulative_log_error_ = 0.0;
      local_50.last_position_ = -1;
      local_50._20_8_ = 0;
      local_50._28_8_ = 0;
      local_50.data_capacity_ = data_capacity;
      build_node_implicit(values,num_keys,data_capacity,&local_50.super_StatAccumulator,&local_78);
      local_68 = (double)((ulong)(local_50.count_ != 0) *
                         (long)(local_50.cumulative_log_error_ / (double)local_50.count_));
      uStack_60 = 0;
      dVar2 = ExpectedIterationsAndShiftsAccumulator::get_expected_num_shifts(&local_50);
      auVar1._8_8_ = uStack_60;
      auVar1._0_8_ = local_68;
    }
    else {
      local_50.super_StatAccumulator._vptr_StatAccumulator =
           (_func_int **)&PTR__StatAccumulator_00113cc8;
      local_50.cumulative_log_error_ = 0.0;
      local_50.last_position_ = 0;
      build_node_implicit(values,num_keys,data_capacity,&local_50.super_StatAccumulator,&local_78);
      dVar2 = 0.0;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (ulong)(local_50.last_position_ != 0) *
                     (long)(local_50.cumulative_log_error_ / (double)local_50.last_position_);
    }
    if (stats != (DataNodeStats *)0x0) {
      stats->num_search_iterations = auVar1._0_8_;
      stats->num_shifts = dVar2;
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar2 * 0.5 * expected_insert_frac;
    auVar1 = vfmadd231sd_fma(auVar3,auVar1,ZEXT816(0x4034000000000000));
    dVar2 = auVar1._0_8_;
  }
  return dVar2;
}

Assistant:

static double compute_expected_cost(
      const V* values, int num_keys, double density,
      double expected_insert_frac,
      const LinearModel<T>* existing_model = nullptr, bool use_sampling = false,
      DataNodeStats* stats = nullptr) {
    if (use_sampling) {
      return compute_expected_cost_sampling(values, num_keys, density,
                                            expected_insert_frac,
                                            existing_model, stats);
    }

    if (num_keys == 0) {
      return 0;
    }

    int data_capacity =
        std::max(static_cast<int>(num_keys / density), num_keys + 1);

    // Compute what the node's model would be
    LinearModel<T> model;
    if (existing_model == nullptr) {
      build_model(values, num_keys, &model);
    } else {
      model.a_ = existing_model->a_;
      model.b_ = existing_model->b_;
    }
    model.expand(static_cast<double>(data_capacity) / num_keys);

    // Compute expected stats in order to compute the expected cost
    double cost = 0;
    double expected_avg_exp_search_iterations = 0;
    double expected_avg_shifts = 0;
    if (expected_insert_frac == 0) {
      ExpectedSearchIterationsAccumulator acc;
      build_node_implicit(values, num_keys, data_capacity, &acc, &model);
      expected_avg_exp_search_iterations = acc.get_stat();
    } else {
      ExpectedIterationsAndShiftsAccumulator acc(data_capacity);
      build_node_implicit(values, num_keys, data_capacity, &acc, &model);
      expected_avg_exp_search_iterations =
          acc.get_expected_num_search_iterations();
      expected_avg_shifts = acc.get_expected_num_shifts();
    }
    cost = kExpSearchIterationsWeight * expected_avg_exp_search_iterations +
           kShiftsWeight * expected_avg_shifts * expected_insert_frac;

    if (stats) {
      stats->num_search_iterations = expected_avg_exp_search_iterations;
      stats->num_shifts = expected_avg_shifts;
    }

    return cost;
  }